

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::ReprintFatalMessage(void)

{
  int iVar1;
  undefined8 uVar2;
  size_t __size;
  LogDestination *this;
  long lVar3;
  bool bVar4;
  
  if (fatal_message != '\0') {
    __size = strlen(&fatal_message);
    if (fLB::FLAGS_logtostderr == 0) {
      fwrite(&fatal_message,__size,1,_stderr);
    }
    uVar2 = fatal_time;
    if ((fLB::FLAGS_logtostderr & 1) != 0) {
      ColoredWriteToStderr(2,&fatal_message,__size);
      return;
    }
    lVar3 = 2;
    do {
      iVar1 = fLI::FLAGS_logbuflevel;
      this = (LogDestination *)(&LogDestination::log_destinations_)[lVar3];
      if (this == (LogDestination *)0x0) {
        this = (LogDestination *)operator_new(0xe8);
        LogDestination::LogDestination(this,(LogSeverity)lVar3,(char *)0x0);
        (&LogDestination::log_destinations_)[lVar3] = this;
      }
      (*this->logger_->_vptr_Logger[2])
                (this->logger_,(ulong)(iVar1 < (LogSeverity)lVar3),uVar2,&fatal_message,__size);
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void ReprintFatalMessage() {
  if (fatal_message[0]) {
    const size_t n = strlen(fatal_message);
    if (!FLAGS_logtostderr) {
      // Also write to stderr (don't color to avoid terminal checks)
      WriteToStderr(fatal_message, n);
    }
    LogDestination::LogToAllLogfiles(GLOG_ERROR, fatal_time, fatal_message, n);
  }
}